

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O2

void FRandom::StaticWriteRNGState(FILE *file)

{
  FRandom *pFVar1;
  FArchive *this;
  long lVar2;
  FRandom **ppFVar3;
  FPNGChunkArchive arc;
  
  FPNGChunkArchive::FPNGChunkArchive(&arc,file,0x644e6172);
  FArchive::operator<<(&arc.super_FArchive,&rngseed);
  ppFVar3 = &RNGList;
  while (pFVar1 = *ppFVar3, pFVar1 != (FRandom *)0x0) {
    if (pFVar1->NameCRC != 0) {
      this = FArchive::operator<<(&arc.super_FArchive,&pFVar1->NameCRC);
      FArchive::operator<<(this,(DWORD *)&pFVar1->idx);
      for (lVar2 = 0x18; lVar2 != 0x68; lVar2 = lVar2 + 4) {
        FArchive::operator<<(&arc.super_FArchive,(DWORD *)((long)&pFVar1->Name + lVar2));
      }
    }
    ppFVar3 = &pFVar1->Next;
  }
  FPNGChunkArchive::~FPNGChunkArchive(&arc);
  return;
}

Assistant:

void FRandom::StaticWriteRNGState (FILE *file)
{
	FRandom *rng;
	FPNGChunkArchive arc (file, RAND_ID);

	arc << rngseed;

	for (rng = FRandom::RNGList; rng != NULL; rng = rng->Next)
	{
		// Only write those RNGs that have names
		if (rng->NameCRC != 0)
		{
			arc << rng->NameCRC << rng->idx;
			for (int i = 0; i < SFMT::N32; ++i)
			{
				arc << rng->sfmt.u[i];
			}
		}
	}
}